

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_RemoveWindowMappingByTarget(GPU_Target *target)

{
  GPU_Context *pGVar1;
  long lVar2;
  GPU_WindowMapping *__dest;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    _gpu_window_mappings_size = 10;
    _gpu_window_mappings = (GPU_WindowMapping *)SDL_malloc(0xa0);
    _gpu_num_window_mappings = 0;
  }
  if (((target != (GPU_Target *)0x0) && (pGVar1 = target->context, pGVar1 != (GPU_Context *)0x0)) &&
     (pGVar1->windowID != 0)) {
    pGVar1->windowID = 0;
    if (0 < (long)_gpu_num_window_mappings) {
      lVar2 = 0;
      __dest = _gpu_window_mappings;
      do {
        if (__dest->target == target) {
          _gpu_num_window_mappings = _gpu_num_window_mappings - 1;
          if ((int)((ulong)(uint)_gpu_num_window_mappings - lVar2) < 1) {
            return;
          }
          memmove(__dest,__dest + 1,
                  ((ulong)(uint)_gpu_num_window_mappings - lVar2 & 0xffffffff) << 4);
          return;
        }
        lVar2 = lVar2 + 1;
        __dest = __dest + 1;
      } while (_gpu_num_window_mappings != lVar2);
    }
  }
  return;
}

Assistant:

void GPU_RemoveWindowMappingByTarget(GPU_Target* target)
{
    Uint32 windowID;
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(target == NULL || target->context == NULL)
        return;

    windowID = target->context->windowID;
    if(windowID == 0)  // Invalid window ID
        return;

    // Unset the target's window
    target->context->windowID = 0;

    // Find the occurrences
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].target == target)
        {
            // Move the remaining entries to replace the removed one
            int num_to_move;
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}